

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_thread_create(uv_thread_t *tid,_func_void_void_ptr *entry,void *arg)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  pthread_attr_t *__attr;
  undefined8 __stacksize;
  pthread_attr_t attr_storage;
  pthread_attr_t local_60;
  
  iVar1 = getrlimit(RLIMIT_STACK,(rlimit *)&local_60);
  if (iVar1 == 0) {
    if (local_60.__align == 0xffffffffffffffff) {
      __stacksize = 0x200000;
    }
    else {
      iVar1 = getpagesize();
      uVar3 = local_60.__align - (ulong)local_60.__align % (ulong)(long)iVar1;
      local_60.__align = uVar3;
      uVar2 = __sysconf(0x4b);
      __stacksize = 0x200000;
      if (uVar2 <= uVar3) {
        __stacksize = local_60.__align;
      }
    }
    if (__stacksize == 0) {
      __attr = (pthread_attr_t *)0x0;
LAB_0010b4a5:
      iVar1 = pthread_create(tid,__attr,(__start_routine *)entry,arg);
      if (__attr != (pthread_attr_t *)0x0) {
        pthread_attr_destroy(__attr);
      }
      return -iVar1;
    }
    __attr = &local_60;
    iVar1 = pthread_attr_init(__attr);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setstacksize(__attr,__stacksize);
      if (iVar1 == 0) goto LAB_0010b4a5;
    }
  }
  abort();
}

Assistant:

int uv_thread_create(uv_thread_t *tid, void (*entry)(void *arg), void *arg) {
  int err;
  size_t stack_size;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;

  attr = NULL;
  stack_size = thread_stack_size();

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  err = pthread_create(tid, attr, (void*(*)(void*)) entry, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}